

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

Vec_Str_t *
Bmc_CollapseOne3(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  int nVars;
  Cnf_Dat_t *p_00;
  sat_solver *pSat0_00;
  sat_solver *pSat1_00;
  sat_solver *pSat2_00;
  sat_solver *pSat3_00;
  Vec_Str_t *pVVar1;
  Vec_Str_t *vSop;
  sat_solver *pSat3;
  sat_solver *pSat2;
  sat_solver *pSat1;
  sat_solver *pSat0;
  Cnf_Dat_t *pCnf;
  int fVerbose_local;
  int fReverse_local;
  int fCanon_local;
  int nBTLimit_local;
  int nCubeLim_local;
  Gia_Man_t *p_local;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  pSat0_00 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pSat1_00 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pSat2_00 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pSat3_00 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  nVars = Gia_ManCiNum(p);
  pVVar1 = Bmc_CollapseOne_int3
                     (pSat0_00,pSat1_00,pSat2_00,pSat3_00,nVars,nCubeLim,nBTLimit,fCanon,fReverse,
                      fVerbose);
  sat_solver_delete(pSat0_00);
  sat_solver_delete(pSat1_00);
  sat_solver_delete(pSat2_00);
  sat_solver_delete(pSat3_00);
  Cnf_DataFree(p_00);
  return pVVar1;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne3( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat0 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    sat_solver * pSat1 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    sat_solver * pSat2 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    sat_solver * pSat3 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    Vec_Str_t * vSop = Bmc_CollapseOne_int3( pSat0, pSat1, pSat2, pSat3, Gia_ManCiNum(p), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    sat_solver_delete( pSat0 );
    sat_solver_delete( pSat1 );
    sat_solver_delete( pSat2 );
    sat_solver_delete( pSat3 );
    Cnf_DataFree( pCnf );
    return vSop;
}